

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage2DDepthCase::createTexture(TexImage2DDepthCase *this)

{
  int internalFormat;
  deUint32 err;
  int width;
  int height;
  TransferFormat TVar1;
  void *data;
  PixelBufferAccess local_e0;
  PixelBufferAccess local_b8;
  undefined1 local_90 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  TextureFormat local_58;
  undefined1 local_50 [8];
  TextureLevel levelData;
  deUint32 tex;
  deUint32 local_18;
  deUint32 dStack_14;
  TransferFormat fmt;
  TexImage2DDepthCase *this_local;
  
  TVar1 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  levelData.m_data.m_cap._4_4_ = 0;
  local_18 = TVar1.format;
  dStack_14 = TVar1.dataType;
  local_58 = glu::mapGLTransferFormat(local_18,dStack_14);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_50,&local_58);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  err = sglr::ContextWrapper::glGetError
                  (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xbdf);
  for (levelH = 0; levelH < (this->super_Texture2DSpecCase).m_numLevels; levelH = levelH + 1) {
    width = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
    height = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-1.5,-2.0,1.7,-1.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_90,2.0,1.5,-1.0,2.0);
    tcu::TextureLevel::setSize((TextureLevel *)local_50,width,height,1);
    tcu::TextureLevel::getAccess(&local_b8,(TextureLevel *)local_50);
    tcu::fillWithComponentGradients(&local_b8,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_90);
    internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    tcu::TextureLevel::getAccess(&local_e0,(TextureLevel *)local_50);
    data = tcu::PixelBufferAccess::getDataPtr(&local_e0);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH,internalFormat,width,height,0,local_18,dStack_14,data);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_50);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}